

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

void __thiscall DROPlayer::ParseFile(DROPlayer *this,UINT32 ticks)

{
  uint uVar1;
  
  uVar1 = ticks + this->_playTick;
  this->_playTick = uVar1;
  if ((this->_playState & 2) == 0) {
    if ((this->_fileHdr).verMajor < 2) {
      while ((this->_fileTick <= uVar1 && ((this->_playState & 2) == 0))) {
        DoCommand_v1(this);
        uVar1 = this->_playTick;
      }
    }
    else {
      while ((this->_fileTick <= uVar1 && ((this->_playState & 2) == 0))) {
        DoCommand_v2(this);
        uVar1 = this->_playTick;
      }
    }
  }
  return;
}

Assistant:

void DROPlayer::ParseFile(UINT32 ticks)
{
	_playTick += ticks;
	if (_playState & PLAYSTATE_END)
		return;
	
	if (_fileHdr.verMajor < 2)
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v1();
	}
	else
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v2();
	}
	
	return;
}